

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_function_apply(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue this_obj;
  JSValue new_target;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  JSValue *argv_00;
  ulong uVar4;
  JSValue JVar5;
  JSValue JVar6;
  uint32_t len;
  uint32_t local_54;
  JSValueUnion local_50;
  int64_t local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  iVar3 = check_function(ctx,this_val);
  if (iVar3 == 0) {
    local_50 = (JSValueUnion)(argv->u).ptr;
    local_48 = argv->tag;
    if (magic != 2 && ((uint)argv[1].tag & 0xfffffffe) == 2) {
      local_40 = 0;
      uStack_38 = 3;
      auVar1._4_4_ = 3;
      auVar1._0_4_ = uStack_3c;
      auVar1._8_8_ = 0;
      JVar5 = JS_CallInternal(ctx,this_val,*argv,(JSValue)(auVar1 << 0x20),0,(JSValue *)0x0,2);
      uVar4 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
      goto LAB_001395f7;
    }
    JVar5.tag = argv[1].tag;
    JVar5.u.ptr = argv[1].u.ptr;
    argv_00 = build_arg_list(ctx,&local_54,JVar5);
    if (argv_00 != (JSValue *)0x0) {
      if ((magic & 1U) == 0) {
        local_40 = 0;
        uStack_38 = 3;
        this_obj.tag = local_48;
        this_obj.u.ptr = local_50.ptr;
        auVar2._4_4_ = 3;
        auVar2._0_4_ = uStack_3c;
        auVar2._8_8_ = 0;
        JVar5 = JS_CallInternal(ctx,this_val,this_obj,(JSValue)(auVar2 << 0x20),local_54,argv_00,2);
      }
      else {
        new_target.tag = local_48;
        new_target.u.ptr = local_50.ptr;
        JVar5 = JS_CallConstructorInternal(ctx,this_val,new_target,local_54,argv_00,2);
      }
      free_arg_list(ctx,argv_00,local_54);
      uVar4 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
      goto LAB_001395f7;
    }
  }
  JVar5 = (JSValue)(ZEXT816(6) << 0x40);
  uVar4 = 0;
LAB_001395f7:
  JVar6.u.ptr = (void *)((ulong)JVar5.u.ptr & 0xffffffff | uVar4);
  JVar6.tag = JVar5.tag;
  return JVar6;
}

Assistant:

static JSValue js_function_apply(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv, int magic)
{
    JSValueConst this_arg, array_arg;
    uint32_t len;
    JSValue *tab, ret;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;
    this_arg = argv[0];
    array_arg = argv[1];
    if ((JS_VALUE_GET_TAG(array_arg) == JS_TAG_UNDEFINED ||
         JS_VALUE_GET_TAG(array_arg) == JS_TAG_NULL) && magic != 2) {
        return JS_Call(ctx, this_val, this_arg, 0, NULL);
    }
    tab = build_arg_list(ctx, &len, array_arg);
    if (!tab)
        return JS_EXCEPTION;
    if (magic & 1) {
        ret = JS_CallConstructor2(ctx, this_val, this_arg, len, (JSValueConst *)tab);
    } else {
        ret = JS_Call(ctx, this_val, this_arg, len, (JSValueConst *)tab);
    }
    free_arg_list(ctx, tab, len);
    return ret;
}